

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

void Js::DynamicTypeHandler::AdjustSlots
               (DynamicObject *object,PropertyIndex newInlineSlotCapacity,int newAuxSlotCapacity)

{
  char *addr;
  ushort uVar1;
  WriteBarrierPtr<void> *pWVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  Type *pTVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  Recycler *this;
  WriteBarrierPtr<void> *addr_00;
  DynamicTypeHandler *this_00;
  ulong uVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  FinalizableObject *addr_01;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x2a8,"(object)","object");
    if (!bVar7) goto LAB_00e618a4;
    *puVar8 = 0;
  }
  this = RecyclableObject::GetRecycler(&object->super_RecyclableObject);
  local_70 = (undefined1  [8])&void*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a18d6ad;
  data.filename._0_4_ = 0x2ac;
  data.plusSize = (long)newAuxSlotCapacity;
  Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_70);
  addr_00 = (WriteBarrierPtr<void> *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (this,(long)newAuxSlotCapacity << 3);
  this_00 = DynamicObject::GetTypeHandler(object);
  uVar1 = this_00->inlineSlotCapacity;
  if (uVar1 == newInlineSlotCapacity) {
    uVar11 = this_00->slotCapacity - (uint)uVar1;
    if (newAuxSlotCapacity <= (int)uVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2b5,"(oldAuxSlotCapacity < newAuxSlotCapacity)",
                                  "oldAuxSlotCapacity < newAuxSlotCapacity");
      if (!bVar7) goto LAB_00e618a4;
      *puVar8 = 0;
    }
    if (0 < (int)uVar11) {
      pWVar2 = (object->auxSlots).ptr;
      if (pWVar2 == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x2ba,"(oldAuxSlots)","oldAuxSlots");
        if (!bVar7) {
LAB_00e618a4:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar8 = 0;
      }
      uVar9 = 1;
      if (1 < (int)uVar11) {
        uVar9 = (ulong)uVar11;
      }
      lVar12 = 0;
      do {
        addr = (char *)((long)&addr_00->ptr + lVar12);
        uVar3 = *(undefined8 *)((long)&pWVar2->ptr + lVar12);
        Memory::Recycler::WBSetBit(addr);
        *(undefined8 *)((long)&addr_00->ptr + lVar12) = uVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        lVar12 = lVar12 + 8;
      } while (uVar9 << 3 != lVar12);
    }
    Memory::Recycler::WBSetBit((char *)&object->auxSlots);
    (object->auxSlots).ptr = addr_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&object->auxSlots);
  }
  else {
    if (this_00->offsetOfInlineSlots == 0x10) {
      VerifyObjectHeaderInlinedTypeHandler(this_00);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cc,"(oldTypeHandler->IsObjectHeaderInlinedTypeHandler())",
                                  "oldTypeHandler->IsObjectHeaderInlinedTypeHandler()");
      if (!bVar7) goto LAB_00e618a4;
      *puVar8 = 0;
    }
    if (uVar1 <= newInlineSlotCapacity) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cd,"(oldInlineSlotCapacity > newInlineSlotCapacity)",
                                  "oldInlineSlotCapacity > newInlineSlotCapacity");
      if (!bVar7) goto LAB_00e618a4;
      *puVar8 = 0;
    }
    if ((uint)uVar1 - (uint)newInlineSlotCapacity != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2ce,
                                  "(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar7) goto LAB_00e618a4;
      *puVar8 = 0;
    }
    if (newAuxSlotCapacity < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cf,
                                  "(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar7) goto LAB_00e618a4;
      *puVar8 = 0;
    }
    bVar7 = Phases::IsEnabled((Phases *)&DAT_015cd718,ObjectHeaderInliningPhase);
    if (bVar7) {
      Output::Print(L"ObjectHeaderInlining: Moving inlined properties to aux slots.\n");
      Output::Flush();
    }
    data._32_8_ = &object->auxSlots;
    pp_Var4 = (&(object->super_RecyclableObject).super_FinalizableObject)[uVar1].
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = pp_Var4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    pTVar5 = (&(object->super_RecyclableObject).type)[uVar1].ptr;
    Memory::Recycler::WBSetBit((char *)(addr_00 + 1));
    uVar3 = data._32_8_;
    addr_00[1].ptr = pTVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00 + 1);
    if (newInlineSlotCapacity != 0) {
      bVar7 = Phases::IsEnabled((Phases *)&DAT_015cd718,ObjectHeaderInliningPhase);
      if (bVar7) {
        Output::Print(L"ObjectHeaderInlining: Moving inlined properties out of the object header.\n"
                     );
        Output::Flush();
      }
      addr_01 = &object[1].super_RecyclableObject.super_FinalizableObject +
                (ushort)(newInlineSlotCapacity - 1);
      puVar10 = (undefined8 *)((ulong)(ushort)(newInlineSlotCapacity - 1) * 8 + uVar3);
      do {
        pp_Var4 = (_func_int **)*puVar10;
        Memory::Recycler::WBSetBit((char *)addr_01);
        (addr_01->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = pp_Var4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        addr_01 = addr_01 + -1;
        puVar10 = puVar10 + -1;
        newInlineSlotCapacity = newInlineSlotCapacity - 1;
      } while (newInlineSlotCapacity != 0);
    }
    Memory::Recycler::WBSetBit((char *)uVar3);
    (object->auxSlots).ptr = addr_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)uVar3);
    object->field_1 = (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0;
  }
  return;
}

Assistant:

void DynamicTypeHandler::AdjustSlots(
        DynamicObject *const object,
        const PropertyIndex newInlineSlotCapacity,
        const int newAuxSlotCapacity)
    {
        Assert(object);

        // Allocate new aux slot array
        Recycler *const recycler = object->GetRecycler();
        TRACK_ALLOC_INFO(recycler, Var, Recycler, 0, newAuxSlotCapacity);
        Field(Var) *const newAuxSlots = reinterpret_cast<Field(Var) *>(
            recycler->AllocZero(newAuxSlotCapacity * sizeof(Field(Var))));

        DynamicTypeHandler *const oldTypeHandler = object->GetTypeHandler();
        const PropertyIndex oldInlineSlotCapacity = oldTypeHandler->GetInlineSlotCapacity();
        if(oldInlineSlotCapacity == newInlineSlotCapacity)
        {
            const int oldAuxSlotCapacity = oldTypeHandler->GetSlotCapacity() - oldInlineSlotCapacity;
            AssertOrFailFast(oldAuxSlotCapacity < newAuxSlotCapacity);
            if(oldAuxSlotCapacity > 0)
            {
                // Copy aux slots to the new array
                Field(Var) *const oldAuxSlots = object->auxSlots;
                Assert(oldAuxSlots);
                int i = 0;
                do
                {
                    newAuxSlots[i] = oldAuxSlots[i];
                } while(++i < oldAuxSlotCapacity);

            #ifdef EXPLICIT_FREE_SLOTS
                recycler->ExplicitFreeNonLeaf(oldAuxSlots, oldAuxSlotCapacity * sizeof(Var));
            #endif
            }

            object->auxSlots = newAuxSlots;
            return;
        }

        // An object header-inlined type handler is transitioning into one that is not. Some inline slots need to move, and
        // there are no old aux slots that need to be copied.
        Assert(oldTypeHandler->IsObjectHeaderInlinedTypeHandler());
        Assert(oldInlineSlotCapacity > newInlineSlotCapacity);
        Assert(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());

        // Move the last few inline slots into the aux slots
        if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
        {
            Output::Print(_u("ObjectHeaderInlining: Moving inlined properties to aux slots.\n"));
            Output::Flush();
        }
        Var *const oldInlineSlots =
            reinterpret_cast<Var *>(
                reinterpret_cast<uintptr_t>(object) + DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots());
        Assert(DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() == 2);
        newAuxSlots[0] = oldInlineSlots[oldInlineSlotCapacity - 2];
        newAuxSlots[1] = oldInlineSlots[oldInlineSlotCapacity - 1];

        if(newInlineSlotCapacity > 0)
        {
            // Move the remaining inline slots such that none are object header-inlined. Copy backwards, as the two buffers may
            // overlap, with the new inline slot array starting beyond the start of the old inline slot array.
            if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
            {
                Output::Print(_u("ObjectHeaderInlining: Moving inlined properties out of the object header.\n"));
                Output::Flush();
            }
            Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(object + 1);
            PropertyIndex i = newInlineSlotCapacity;
            do
            {
                --i;
                newInlineSlots[i] = oldInlineSlots[i];
            } while(i > 0);
        }

        object->auxSlots = newAuxSlots;
        object->objectArray = nullptr;
    }